

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall google::protobuf::RepeatedField<int>::Add(RepeatedField<int> *this,int *value)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int tmp;
  uint32_t size;
  int *value_local;
  RepeatedField<int> *this_local;
  
  uVar1 = this->current_size_;
  if (uVar1 == this->total_size_) {
    iVar2 = *value;
    Reserve(this,this->total_size_ + 1);
    piVar3 = elements(this);
    piVar3[uVar1] = iVar2;
  }
  else {
    iVar2 = *value;
    piVar3 = elements(this);
    piVar3[uVar1] = iVar2;
  }
  this->current_size_ = uVar1 + 1;
  return;
}

Assistant:

inline void RepeatedField<Element>::Add(const Element& value) {
  uint32_t size = current_size_;
  if (static_cast<int>(size) == total_size_) {
    // value could reference an element of the array. Reserving new space will
    // invalidate the reference. So we must make a copy first.
    auto tmp = value;
    Reserve(total_size_ + 1);
    elements()[size] = std::move(tmp);
  } else {
    elements()[size] = value;
  }
  current_size_ = size + 1;
}